

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

vector2D<basisu::pvrtc4_block> * __thiscall
basisu::vector2D<basisu::pvrtc4_block>::operator=
          (vector2D<basisu::pvrtc4_block> *this,vector2D<basisu::pvrtc4_block> *other)

{
  vector2D<basisu::pvrtc4_block> *in_RSI;
  vector2D<basisu::pvrtc4_block> *in_RDI;
  
  if (in_RDI != in_RSI) {
    in_RDI->m_width = in_RSI->m_width;
    in_RDI->m_height = in_RSI->m_height;
    vector<basisu::pvrtc4_block>::operator=
              ((vector<basisu::pvrtc4_block> *)in_RDI,(vector<basisu::pvrtc4_block> *)in_RSI);
  }
  return in_RDI;
}

Assistant:

vector2D &operator= (const vector2D &other)
		{
			if (this != &other)
			{
				m_width = other.m_width;
				m_height = other.m_height;
				m_values = other.m_values;
			}
			return *this;
		}